

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

LoopEvent rec_iterl(jit_State *J,BCIns iterins)

{
  byte bVar1;
  uint uVar2;
  LoopEvent LVar3;
  
  bVar1 = (byte)(iterins >> 8);
  uVar2 = J->base[bVar1];
  if (uVar2 == 0) {
    uVar2 = sload(J,(uint)bVar1);
  }
  if ((uVar2 & 0x1f000000) == 0) {
    J->maxslot = bVar1 - 3;
    J->pc = J->pc + 1;
    LVar3 = LOOPEV_LEAVE;
  }
  else {
    J->base[bVar1 - 1] = J->base[bVar1];
    J->maxslot = ((uint)*(byte *)((long)J->pc + -1) + (uint)bVar1) - 1;
    J->pc = J->pc + ((ulong)(iterins >> 0x10) - 0x7fff);
    LVar3 = LOOPEV_ENTER;
  }
  return LVar3;
}

Assistant:

static LoopEvent rec_iterl(jit_State *J, const BCIns iterins)
{
  BCReg ra = bc_a(iterins);
  if (!tref_isnil(getslot(J, ra))) {  /* Looping back? */
    J->base[ra-1] = J->base[ra];  /* Copy result of ITERC to control var. */
    J->maxslot = ra-1+bc_b(J->pc[-1]);
    J->pc += bc_j(iterins)+1;
    return LOOPEV_ENTER;
  } else {
    J->maxslot = ra-3;
    J->pc++;
    return LOOPEV_LEAVE;
  }
}